

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void sorter_selection_sort(int64_t *dst,size_t size)

{
  int64_t iVar1;
  int64_t _sort_swap_temp;
  size_t j;
  size_t i;
  size_t size_local;
  int64_t *dst_local;
  
  if (1 < size) {
    for (i = 0; j = i, i < size; i = i + 1) {
      while (j = j + 1, j < size) {
        if (dst[j] - dst[i] < 0) {
          iVar1 = dst[i];
          dst[i] = dst[j];
          dst[j] = iVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void SELECTION_SORT(SORT_TYPE *dst, const size_t size) {
  size_t i, j;

  /* don't bother sorting an array of size <= 1 */
  if (size <= 1) {
    return;
  }

  for (i = 0; i < size; i++) {
    for (j = i + 1; j < size; j++) {
      if (SORT_CMP(dst[j], dst[i]) < 0) {
        SORT_SWAP(dst[i], dst[j]);
      }
    }
  }
}